

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_lzhuf.cxx
# Opt level: O3

void __thiscall xray_re::_lzhuf::Putcode(_lzhuf *this,int l,uint c)

{
  uchar uVar1;
  uint uVar2;
  byte bVar3;
  undefined4 extraout_EDX;
  undefined4 in_register_00000014;
  undefined4 extraout_var;
  
  uVar2 = c >> (this->putlen & 0x1f) | this->putbuf;
  this->putbuf = uVar2;
  bVar3 = this->putlen + (char)l;
  this->putlen = bVar3;
  if (7 < bVar3) {
    putc(this,uVar2 >> 8,(FILE *)CONCAT44(in_register_00000014,c));
    bVar3 = this->putlen - 8;
    this->putlen = bVar3;
    if (bVar3 < 8) {
      this->putbuf = this->putbuf << 8;
      this->codesize = this->codesize + 1;
    }
    else {
      putc(this,this->putbuf,(FILE *)CONCAT44(extraout_var,extraout_EDX));
      this->codesize = this->codesize + 2;
      uVar1 = this->putlen + 0xf8;
      this->putlen = uVar1;
      this->putbuf = c << ((char)l - uVar1 & 0x1f);
    }
  }
  return;
}

Assistant:

void _lzhuf::Putcode(int l, unsigned c)		/* output c bits of code */
{
	putbuf |= c >> putlen;
	if ((putlen += l) >= 8) {
		putc(putbuf >> 8);
		if ((putlen -= 8) >= 8) {
			putc(putbuf);
			codesize += 2;
			putlen -= 8;
			putbuf = c << (l - putlen);
		} else {
			putbuf <<= 8;
			codesize++;
		}
	}
}